

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::SerialArenaChunk
          (SerialArenaChunk *this,uint32_t capacity,void *me,SerialArena *serial)

{
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long, 0, 1>, std::integer_sequence<unsigned long, 0, 1, 2>, std::integer_sequence<unsigned long, 0, 1, 2>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long, 0, 1>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2>, N = 0UL, Char = char]"
                 );
  }
  *(undefined8 *)this = 0;
  *(uint32_t *)(this + 8) = capacity;
  *(undefined4 *)(this + 0xc) = 1;
  *(void **)(this + 0x10) = me;
  if (1 < capacity) {
    memset(this + 0x18,0,(ulong)(capacity - 1) << 3);
  }
  *(SerialArena **)(this + (ulong)capacity * 8 + 0x10) = serial;
  if (1 < capacity) {
    memset(this + (ulong)capacity * 8 + 0x18,0,(ulong)(capacity - 1) << 3);
    return;
  }
  return;
}

Assistant:

SerialArenaChunk(uint32_t capacity, void* me, SerialArena* serial) {
    // We use `layout`/`ids`/`arenas` local variables to avoid recomputing
    // offsets if we were to call id(i)/arena(i) repeatedly.
    const layout_type layout = Layout(capacity);
    new (layout.Pointer<kHeader>(ptr())) SerialArenaChunkHeader{capacity, 1};

    std::atomic<void*>* ids = layout.Pointer<kIds>(ptr());
    new (&ids[0]) std::atomic<void*>{me};
    for (uint32_t i = 1; i < capacity; ++i) {
      new (&ids[i]) std::atomic<void*>{nullptr};
    }

    std::atomic<SerialArena*>* arenas = layout.Pointer<kArenas>(ptr());
    new (&arenas[0]) std::atomic<SerialArena*>{serial};
    for (uint32_t i = 1; i < capacity; ++i) {
      new (&arenas[i]) std::atomic<SerialArena*>{nullptr};
    }
  }